

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c
# Opt level: O0

int hex2byte(uint8_t *dest,uint8_t *source)

{
  uint8_t *source_local;
  uint8_t *dest_local;
  
  if ((*source < 0x30) || (0x39 < *source)) {
    if (((*source < 0x61) || (0x66 < *source)) && ((*source < 0x41 || (0x46 < *source)))) {
      return -1;
    }
    *dest = (*source | 0x20) + 0xa9;
  }
  else {
    *dest = *source + 0xd0;
  }
  *dest = *dest << 4;
  if ((source[1] < 0x30) || (0x39 < source[1])) {
    if (((source[1] < 0x61) || (0x66 < source[1])) && ((source[1] < 0x41 || (0x46 < source[1])))) {
      return -1;
    }
    *dest = *dest | (source[1] | 0x20) + 0xa9;
  }
  else {
    *dest = *dest | source[1] - 0x30;
  }
  return 0;
}

Assistant:

static inline int hex2byte(uint8_t *dest, const uint8_t *source) {
  if (source[0] >= '0' && source[0] <= '9')
    *dest = (source[0] - '0');
  else if ((source[0] >= 'a' && source[0] <= 'f') ||
           (source[0] >= 'A' && source[0] <= 'F'))
    *dest = (source[0] | 32) - 87;
  else
    return -1;
  *dest <<= 4;
  if (source[1] >= '0' && source[1] <= '9')
    *dest |= (source[1] - '0');
  else if ((source[1] >= 'a' && source[1] <= 'f') ||
           (source[1] >= 'A' && source[1] <= 'F'))
    *dest |= (source[1] | 32) - 87;
  else
    return -1;
  return 0;
}